

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fnmatch.cc
# Opt level: O0

bool absl::lts_20240722::log_internal::FNMatch(string_view pattern,string_view str)

{
  char cVar1;
  bool bVar2;
  const_reference pvVar3;
  size_type sVar4;
  size_type sVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  bool local_79;
  size_t match;
  char *local_58;
  size_t end;
  string_view fixed_portion;
  undefined1 auStack_30 [7];
  bool in_wildcard_match;
  string_view str_local;
  string_view pattern_local;
  
  str_local._M_len = (size_t)str._M_str;
  _auStack_30 = str._M_len;
  str_local._M_str = (char *)pattern._M_len;
  fixed_portion._M_str._7_1_ = 0;
  while( true ) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&str_local._M_str);
    if (bVar2) {
      local_79 = true;
      if ((fixed_portion._M_str._7_1_ & 1) == 0) {
        local_79 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                             ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30);
      }
      return local_79;
    }
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30);
    if (bVar2) break;
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)&str_local._M_str);
    if (*pvVar3 == '*') {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&str_local._M_str,1);
      fixed_portion._M_str._7_1_ = 1;
    }
    else if (*pvVar3 == '?') {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&str_local._M_str,1);
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30,1);
    }
    else if ((fixed_portion._M_str._7_1_ & 1) == 0) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                         ((basic_string_view<char,_std::char_traits<char>_> *)&str_local._M_str);
      cVar1 = *pvVar3;
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30);
      if (cVar1 != *pvVar3) {
        return false;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&str_local._M_str,1);
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30,1);
    }
    else {
      end = (size_t)str_local._M_str;
      fixed_portion._M_len = (size_t)pattern._M_str;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)&end,"*?",0);
      if (sVar4 != 0xffffffffffffffff) {
        bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&end,0,sVar4);
        match = bVar6._M_len;
        end = match;
        local_58 = bVar6._M_str;
        fixed_portion._M_len = (size_t)local_58;
      }
      bVar6._M_str = (char *)fixed_portion._M_len;
      bVar6._M_len = end;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30,bVar6,0);
      if (sVar4 == 0xffffffffffffffff) {
        return false;
      }
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&end);
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&str_local._M_str,sVar5);
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&end);
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30,sVar4 + sVar5);
      fixed_portion._M_str._7_1_ = 0;
    }
  }
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)&str_local._M_str,'*',0);
  return sVar4 == 0xffffffffffffffff;
}

Assistant:

bool FNMatch(absl::string_view pattern, absl::string_view str) {
  bool in_wildcard_match = false;
  while (true) {
    if (pattern.empty()) {
      // `pattern` is exhausted; succeed if all of `str` was consumed matching
      // it.
      return in_wildcard_match || str.empty();
    }
    if (str.empty()) {
      // `str` is exhausted; succeed if `pattern` is empty or all '*'s.
      return pattern.find_first_not_of('*') == pattern.npos;
    }
    switch (pattern.front()) {
      case '*':
        pattern.remove_prefix(1);
        in_wildcard_match = true;
        break;
      case '?':
        pattern.remove_prefix(1);
        str.remove_prefix(1);
        break;
      default:
        if (in_wildcard_match) {
          absl::string_view fixed_portion = pattern;
          const size_t end = fixed_portion.find_first_of("*?");
          if (end != fixed_portion.npos) {
            fixed_portion = fixed_portion.substr(0, end);
          }
          const size_t match = str.find(fixed_portion);
          if (match == str.npos) {
            return false;
          }
          pattern.remove_prefix(fixed_portion.size());
          str.remove_prefix(match + fixed_portion.size());
          in_wildcard_match = false;
        } else {
          if (pattern.front() != str.front()) {
            return false;
          }
          pattern.remove_prefix(1);
          str.remove_prefix(1);
        }
        break;
    }
  }
}